

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

Vta_Obj_t * Vga_ManFind(Vta_Man_t *p,int iObj,int iFrame)

{
  int iVar1;
  int iVar2;
  Vta_Obj_t *pVVar3;
  int *piVar4;
  uint uVar5;
  Vta_Obj_t *pVVar6;
  
  uVar5 = (uint)((iFrame + iObj + 1) * (iFrame + iObj)) % (uint)p->nBins;
  iVar1 = p->pBins[(int)uVar5];
  if ((-1 < (long)iVar1) && (iVar2 = p->nObjs, iVar1 < iVar2)) {
    if (iVar1 == 0) {
      pVVar3 = (Vta_Obj_t *)0x0;
    }
    else {
      pVVar3 = p->pObjs + iVar1;
    }
    piVar4 = p->pBins + (int)uVar5;
    while ((pVVar3 != (Vta_Obj_t *)0x0 && ((pVVar3->iObj != iObj || (pVVar3->iFrame != iFrame))))) {
      iVar1 = pVVar3->iNext;
      if (((long)iVar1 < 0) || (iVar2 <= iVar1)) goto LAB_0057af2f;
      if (iVar1 == 0) {
        pVVar6 = (Vta_Obj_t *)0x0;
      }
      else {
        pVVar6 = p->pObjs + iVar1;
      }
      piVar4 = &pVVar3->iNext;
      pVVar3 = pVVar6;
    }
    iVar1 = *piVar4;
    if ((-1 < (long)iVar1) && (iVar1 < iVar2)) {
      if (iVar1 == 0) {
        pVVar3 = (Vta_Obj_t *)0x0;
      }
      else {
        pVVar3 = p->pObjs + iVar1;
      }
      return pVVar3;
    }
  }
LAB_0057af2f:
  __assert_fail("i >= 0 && i < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                ,0x68,"Vta_Obj_t *Vta_ManObj(Vta_Man_t *, int)");
}

Assistant:

static inline Vta_Obj_t * Vga_ManFind( Vta_Man_t * p, int iObj, int iFrame )
{
    int * pPlace = Vga_ManLookup( p, iObj, iFrame );
    return Vta_ManObj(p, *pPlace);
}